

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_rect nk_layout_space_rect_to_screen(nk_context *ctx,nk_rect ret)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  nk_rect nVar4;
  
  nVar4._8_8_ = ret._8_8_;
  pnVar3 = ctx->current->layout;
  uVar1 = pnVar3->at_x;
  uVar2 = pnVar3->at_y;
  nVar4.x = ret.x + ((float)uVar1 - (float)((uint)*pnVar3->offset & 0xffff));
  nVar4.y = ret.y + ((float)uVar2 - (float)((uint)*pnVar3->offset >> 0x10));
  return nVar4;
}

Assistant:

NK_API struct nk_rect
nk_layout_space_rect_to_screen(struct nk_context *ctx, struct nk_rect ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += layout->at_x - layout->offset->x;
    ret.y += layout->at_y - layout->offset->y;
    return ret;
}